

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O2

int base64toValue(char base64character,uchar *value)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = base64character + 0xbf;
  iVar1 = 0;
  if (0x19 < bVar2) {
    if ((byte)(base64character + 0x9fU) < 0x1a) {
      bVar2 = base64character + 0xb9;
    }
    else if ((byte)(base64character - 0x30U) < 10) {
      bVar2 = base64character + 4;
    }
    else if (base64character == '+') {
      bVar2 = 0x3e;
    }
    else if (base64character == '/') {
      bVar2 = 0x3f;
    }
    else {
      iVar1 = -1;
      bVar2 = 0;
    }
  }
  *value = bVar2;
  return iVar1;
}

Assistant:

static int base64toValue(char base64character, unsigned char* value)
{
    int result = 0;
    if (('A' <= base64character) && (base64character <= 'Z'))
    {
        *value = base64character - 'A';
    }
    else if (('a' <= base64character) && (base64character <= 'z'))
    {
        *value = ('Z' - 'A') + 1 + (base64character - 'a');
    }
    else if (('0' <= base64character) && (base64character <= '9'))
    {
        *value = ('Z' - 'A') + 1 + ('z' - 'a') + 1 + (base64character - '0');
    }
    else if ('+' == base64character)
    {
        *value = 62;
    }
    else if ('/' == base64character)
    {
        *value = 63;
    }
    else
    {
        *value = 0;
        result = -1;
    }
    return result;
}